

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong in_RSI;
  long in_RDI;
  ulong uVar7;
  int64_t i;
  int64_t large;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *newstore;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff50;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff68;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff70;
  long lVar8;
  ulong local_88;
  ulong *local_70;
  long local_28;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    pvVar3 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar8 = *(long *)(in_RDI + 8);
      if (lVar8 != 0) {
        lVar1 = *(long *)(lVar8 + -8);
        for (lVar4 = lVar8 + lVar1 * 0x20; lVar8 != lVar4; lVar4 = lVar4 + -0x20) {
          std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::~function
                    ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x19ed8d8);
        }
        operator_delete__((void *)(lVar8 + -8),lVar1 * 0x20 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar5 = SUB168(auVar2 * ZEXT816(0x20),0);
      uVar7 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar7);
      *puVar6 = in_RSI;
      puVar6 = puVar6 + 1;
      if (in_RSI != 0) {
        local_70 = puVar6;
        do {
          std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::function(in_stack_ffffffffffffff50)
          ;
          local_70 = local_70 + 4;
        } while (local_70 != puVar6 + in_RSI * 4);
      }
      local_88 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_88 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_28 = 0; local_28 < (long)local_88; local_28 = local_28 + 1) {
        std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      if ((*(long *)(in_RDI + 8) != 0) && (lVar8 = *(long *)(in_RDI + 8), lVar8 != 0)) {
        pvVar3 = (void *)(lVar8 + -8);
        lVar1 = *(long *)(lVar8 + -8);
        lVar4 = lVar8 + lVar1 * 0x20;
        if (lVar8 != lVar4) {
          do {
            lVar4 = lVar4 + -0x20;
            std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::~function
                      ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x19edad7);
          } while (lVar4 != lVar8);
        }
        operator_delete__(pvVar3,lVar1 * 0x20 + 8);
      }
      *(ulong **)(in_RDI + 8) = puVar6;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}